

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O0

void libxml_xmlRelaxNGValidityGenericWarningFuncHandler(void *ctx,char *str)

{
  PyObject *op;
  PyObject *pPVar1;
  xmlRelaxNGValidCtxtPyCtxtPtr pyCtxt;
  PyObject *result;
  PyObject *list;
  char *str_local;
  void *ctx_local;
  
  op = (PyObject *)PyTuple_New(2);
  pPVar1 = libxml_charPtrWrap(str);
  PyTuple_SetItem(op,0,pPVar1);
  PyTuple_SetItem(op,1,*(undefined8 *)((long)ctx + 0x10));
  _Py_XINCREF(*(PyObject **)((long)ctx + 0x10));
  pPVar1 = (PyObject *)PyObject_CallObject(*ctx,op);
  if (pPVar1 == (PyObject *)0x0) {
    PyErr_Print();
  }
  _Py_XDECREF(op);
  _Py_XDECREF(pPVar1);
  return;
}

Assistant:

static void
libxml_xmlRelaxNGValidityGenericWarningFuncHandler(void *ctx, char *str) 
{
    PyObject *list;
    PyObject *result;
    xmlRelaxNGValidCtxtPyCtxtPtr pyCtxt;
    
    pyCtxt = (xmlRelaxNGValidCtxtPyCtxtPtr)ctx;

    list = PyTuple_New(2);
    PyTuple_SetItem(list, 0, libxml_charPtrWrap(str));
    PyTuple_SetItem(list, 1, pyCtxt->arg);
    Py_XINCREF(pyCtxt->arg);
    result = PyObject_CallObject(pyCtxt->warn, list);
    if (result == NULL) 
    {
        /* TODO: manage for the exception to be propagated... */
        PyErr_Print();
    }
    Py_XDECREF(list);
    Py_XDECREF(result);
}